

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,U32 mls,int extDict)

{
  BYTE *pBVar1;
  uint uVar2;
  uint uVar3;
  U32 *pUVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  U32 UVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  BYTE *pBVar17;
  int iVar18;
  bool bVar19;
  int local_b0;
  U32 dummy32;
  BYTE *local_88;
  ulong local_80;
  ulong local_78;
  BYTE *local_70;
  ulong local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ulong local_48;
  U32 *local_40;
  ulong local_38;
  
  pUVar4 = ms->hashTable;
  sVar6 = ZSTD_hashPtr(ip,(ms->cParams).hashLog,mls);
  local_40 = ms->chainTable;
  uVar14 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar2 = pUVar4[sVar6];
  local_88 = (ms->window).base;
  local_50 = (ms->window).dictBase;
  local_80 = (ulong)(ms->window).dictLimit;
  local_58 = local_50 + local_80;
  local_60 = local_88 + local_80;
  uVar12 = (int)ip - (int)local_88;
  local_68 = (ulong)uVar12;
  uVar10 = uVar12 - uVar14;
  local_78 = 0;
  if (uVar12 < uVar14) {
    uVar10 = 0;
  }
  uVar3 = (ms->window).lowLimit;
  uVar5 = (ms->cParams).searchLog;
  pUVar4[sVar6] = uVar12;
  uVar7 = (ulong)((uVar12 & uVar14) * 2);
  puVar16 = local_40 + uVar7;
  puVar11 = local_40 + uVar7 + 1;
  iVar18 = 1 << ((byte)uVar5 & 0x1f);
  local_b0 = uVar12 + 9;
  uVar7 = 8;
  local_38 = 0;
  local_70 = ip;
  do {
    uVar15 = (ulong)uVar2;
    bVar19 = iVar18 == 0;
    iVar18 = iVar18 + -1;
    if ((bVar19) || (uVar2 < uVar3)) goto LAB_0039f341;
    uVar8 = local_78;
    if (local_38 < local_78) {
      uVar8 = local_38;
    }
    if ((extDict == 0) || (local_80 <= uVar8 + uVar15)) {
      pBVar17 = local_88 + uVar15;
      sVar6 = ZSTD_count(local_70 + uVar8,pBVar17 + uVar8,iend);
      uVar8 = sVar6 + uVar8;
    }
    else {
      pBVar1 = local_50 + uVar15;
      local_48 = uVar7;
      sVar6 = ZSTD_count_2segments(local_70 + uVar8,pBVar1 + uVar8,iend,local_58,local_60);
      uVar8 = sVar6 + uVar8;
      uVar7 = local_48;
      pBVar17 = local_88 + uVar15;
      if (uVar8 + uVar15 < local_80) {
        pBVar17 = pBVar1;
      }
    }
    if ((uVar7 < uVar8) && (uVar7 = uVar8, local_b0 - uVar2 < uVar8)) {
      local_b0 = uVar2 + (int)uVar8;
    }
    if (local_70 + uVar8 == iend) goto LAB_0039f341;
    puVar9 = local_40 + (uVar2 & uVar14) * 2;
    if (pBVar17[uVar8] < local_70[uVar8]) {
      *puVar16 = uVar2;
      if (uVar2 <= uVar10) {
        puVar16 = &dummy32;
LAB_0039f341:
        *puVar11 = 0;
        *puVar16 = 0;
        if (uVar7 < 0x181) {
          UVar13 = (local_b0 - (int)local_68) - 8;
        }
        else {
          UVar13 = (int)uVar7 - 0x180;
          if (0xbf < UVar13) {
            UVar13 = 0xc0;
          }
        }
        return UVar13;
      }
      puVar9 = puVar9 + 1;
      local_38 = uVar8;
      puVar16 = puVar9;
    }
    else {
      *puVar11 = uVar2;
      puVar11 = puVar9;
      local_78 = uVar8;
      if (uVar2 <= uVar10) {
        puVar11 = &dummy32;
        goto LAB_0039f341;
      }
    }
    uVar2 = *puVar9;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, const int extDict)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    assert(windowLow > 0);
    while (nbCompares-- && (matchIndex >= windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if (!extDict || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if actually extDict */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}